

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiTable::~ImGuiTable(ImGuiTable *this)

{
  ImVector<ImGuiTableColumnSortSpecs> *in_RDI;
  
  ImGui::MemFree(in_RDI);
  ImVector<ImGuiTableColumnSortSpecs>::~ImVector(in_RDI);
  ImGuiTextBuffer::~ImGuiTextBuffer((ImGuiTextBuffer *)0x149fc0);
  return;
}

Assistant:

~ImGuiTable()               { IM_FREE(RawData); }